

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O2

string * __thiscall
argParserAdvancedConfiguration::getAdditionalHelpFor
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this,string *command)

{
  bool bVar1;
  argument *__rhs;
  string help;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)command);
  __rhs = getArgument(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (__rhs == (argument *)0x0) {
    std::operator+(&local_100,"no such command \"",command);
    std::operator+(__return_storage_ptr__,&local_100,"\"");
  }
  else {
    std::__cxx11::string::string((string *)&local_100,(string *)&__rhs->additionalHelp);
    std::operator+(&local_e0,"\n additional help for \"",command);
    std::operator+(&local_c0,&local_e0,"\" \n\t <");
    std::operator+(&local_a0,&local_c0,&__rhs->argShort);
    std::operator+(&local_80,&local_a0,">  <");
    std::operator+(&local_60,&local_80,&__rhs->argLong);
    std::operator+(&local_120,&local_60,">  \t");
    std::operator+(__return_storage_ptr__,&local_120,&__rhs->helpMessage);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar1 = std::operator!=(&local_100,"");
    if (bVar1) {
      std::operator+(&local_120,"\n",&local_100);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

string argParserAdvancedConfiguration::getAdditionalHelpFor(string command){

    argument * arg = getArgument(command);
    if(arg == nullptr)
        return "no such command \"" + command +"\"";

    string help = arg->additionalHelp;
    string out = "\n additional help for \"" + command + "\" \n\t <" +  arg->argShort+ ">  <" +
            arg->argLong + ">  \t" + arg->helpMessage;
    if(help != "")
        out += "\n" + help;
    else
        out += "\n\t no additional help available";
    return out;
}